

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamHttp::ReceiveResponse(BamHttp *this)

{
  bool bVar1;
  ulong uVar2;
  string *s;
  long *in_RDI;
  string headerLine;
  string responseHeader;
  TcpSocket *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec8;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  HttpResponseHeader *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [24];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  IBamIODevice *in_stack_ffffffffffffff30;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  int64_t in_stack_ffffffffffffffa0;
  TcpSocket *in_stack_ffffffffffffffa8;
  string local_30 [47];
  byte local_1;
  
  std::__cxx11::string::string(local_30);
  do {
    bVar1 = TcpSocket::WaitForReadLine(in_stack_fffffffffffffeb8);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001e42e1;
    }
    TcpSocket::ReadLine_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::operator+=(local_30,(string *)&stack0xffffffffffffffa0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    bVar1 = endsWith((string *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    s = (string *)operator_new(0x68);
    HttpResponseHeader::HttpResponseHeader(in_stack_fffffffffffffee0,s);
    in_RDI[0x14] = (long)s;
    bVar1 = HttpHeader::IsValid((HttpHeader *)in_RDI[0x14]);
    if (bVar1) {
      local_1 = 1;
    }
    else {
      paVar3 = (allocator *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"BamHttp::ReceiveResponse",paVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"could not parse HTTP response",&local_f9);
      IBamIODevice::SetErrorString
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      (**(code **)(*in_RDI + 0x10))();
      local_1 = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"BamHttp::ReceiveResponse",&local_81);
    paVar3 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"empty HTTP response",paVar3);
    IBamIODevice::SetErrorString
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    (**(code **)(*in_RDI + 0x10))();
    local_1 = 0;
  }
LAB_001e42e1:
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool BamHttp::ReceiveResponse()
{

    // fetch header, up until double new line
    std::string responseHeader;
    do {

        // make sure we can read a line
        if (!m_socket->WaitForReadLine()) return false;

        // read line & append to full header
        const std::string headerLine = m_socket->ReadLine();
        responseHeader += headerLine;

    } while (!endsWith(responseHeader, DOUBLE_NEWLINE));

    // sanity check
    if (responseHeader.empty()) {
        SetErrorString("BamHttp::ReceiveResponse", "empty HTTP response");
        Close();
        return false;
    }

    // create response from header text
    m_response = new HttpResponseHeader(responseHeader);
    if (!m_response->IsValid()) {
        SetErrorString("BamHttp::ReceiveResponse", "could not parse HTTP response");
        Close();
        return false;
    }

    // if we get here, success
    return true;
}